

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int jsonCacheInsert(sqlite3_context *ctx,JsonParse *pParse)

{
  sqlite3 *db;
  int iVar1;
  undefined8 *pAux;
  AuxData *pAVar2;
  void *pvVar3;
  
  pAVar2 = ctx->pVdbe->pAuxData;
  do {
    if (pAVar2 == (AuxData *)0x0) {
LAB_001b97b7:
      db = ctx->pOut->db;
      pAux = (undefined8 *)sqlite3DbMallocZero(db,0x30);
      if (pAux != (undefined8 *)0x0) {
        *pAux = db;
        sqlite3_set_auxdata(ctx,-0x68f72,pAux,jsonCacheDeleteGeneric);
        for (pAVar2 = ctx->pVdbe->pAuxData; pAVar2 != (AuxData *)0x0; pAVar2 = pAVar2->pNextAux) {
          if (pAVar2->iAuxArg == -0x68f72) {
            pvVar3 = pAVar2->pAux;
            if (pvVar3 == (void *)0x0) {
              return 7;
            }
LAB_001b981b:
            iVar1 = *(int *)((long)pvVar3 + 8);
            if (3 < iVar1) {
              jsonParseFree(*(JsonParse **)((long)pvVar3 + 0x10));
              *(undefined8 *)((long)pvVar3 + 0x10) = *(undefined8 *)((long)pvVar3 + 0x18);
              *(undefined8 *)((long)pvVar3 + 0x18) = *(undefined8 *)((long)pvVar3 + 0x20);
              *(undefined8 *)((long)pvVar3 + 0x20) = *(undefined8 *)((long)pvVar3 + 0x28);
              iVar1 = 3;
            }
            pParse->nJPRef = pParse->nJPRef + 1;
            pParse->bReadOnly = '\x01';
            pParse->eEdit = '\0';
            *(JsonParse **)((long)pvVar3 + (long)iVar1 * 8 + 0x10) = pParse;
            *(int *)((long)pvVar3 + 8) = iVar1 + 1;
            return 0;
          }
        }
      }
      return 7;
    }
    if (pAVar2->iAuxArg == -0x68f72) {
      pvVar3 = pAVar2->pAux;
      if (pvVar3 != (void *)0x0) goto LAB_001b981b;
      goto LAB_001b97b7;
    }
    pAVar2 = pAVar2->pNextAux;
  } while( true );
}

Assistant:

static int jsonCacheInsert(
  sqlite3_context *ctx,   /* The SQL statement context holding the cache */
  JsonParse *pParse       /* The parse object to be added to the cache */
){
  JsonCache *p;

  assert( pParse->zJson!=0 );
  assert( pParse->bJsonIsRCStr );
  assert( pParse->delta==0 );
  p = sqlite3_get_auxdata(ctx, JSON_CACHE_ID);
  if( p==0 ){
    sqlite3 *db = sqlite3_context_db_handle(ctx);
    p = sqlite3DbMallocZero(db, sizeof(*p));
    if( p==0 ) return SQLITE_NOMEM;
    p->db = db;
    sqlite3_set_auxdata(ctx, JSON_CACHE_ID, p, jsonCacheDeleteGeneric);
    p = sqlite3_get_auxdata(ctx, JSON_CACHE_ID);
    if( p==0 ) return SQLITE_NOMEM;
  }
  if( p->nUsed >= JSON_CACHE_SIZE ){
    jsonParseFree(p->a[0]);
    memmove(p->a, &p->a[1], (JSON_CACHE_SIZE-1)*sizeof(p->a[0]));
    p->nUsed = JSON_CACHE_SIZE-1;
  }
  assert( pParse->nBlobAlloc>0 );
  pParse->eEdit = 0;
  pParse->nJPRef++;
  pParse->bReadOnly = 1;
  p->a[p->nUsed] = pParse;
  p->nUsed++;
  return SQLITE_OK;
}